

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void av1_decode_tg_tiles_and_wrapup
               (AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,uint8_t **p_data_end,int start_tile,
               int end_tile,int initialize_flag)

{
  AV1_COMMON *cm_00;
  TileBufferDec (*tile_buffers) [64];
  ThreadData *td;
  AV1CdefSync *cdef_sync;
  uint *puVar1;
  uint8_t uVar2;
  TileDataDec *pTVar3;
  YV12_BUFFER_CONFIG *frame;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  SequenceHeader *pSVar8;
  uint8_t *puVar9;
  pthread_mutex_t *ppVar10;
  pthread_cond_t *ppVar11;
  int *piVar12;
  CB_BUFFER *__s;
  pthread_cond_t *__cond;
  byte bVar13;
  uint col;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int p;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  aom_reader *r;
  uint uVar24;
  uint uVar25;
  AV1_COMMON *cm;
  TileInfo *tile;
  int tile_col;
  FRAME_CONTEXT *__dest;
  long lVar26;
  int i;
  int iVar27;
  uint uVar28;
  RestorationInfo *rsi;
  long lVar29;
  AV1DecRowMTSync *dec_row_mt_sync;
  int iVar30;
  int col_00;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  uint8_t *local_110;
  uint local_8c;
  
  cm_00 = &pbi->common;
  (pbi->dcb).xd.error_info = (pbi->common).error;
  if (initialize_flag != 0) {
    if ((((pbi->common).rst_info[0].frame_restoration_type == RESTORE_NONE) &&
        ((pbi->common).rst_info[1].frame_restoration_type == RESTORE_NONE)) &&
       ((pbi->common).rst_info[2].frame_restoration_type == RESTORE_NONE)) {
      pSVar8 = (pbi->common).seq_params;
    }
    else {
      rsi = (pbi->common).rst_info;
      av1_alloc_restoration_buffers(cm_00,true);
      for (uVar19 = 0; pSVar8 = (pbi->common).seq_params,
          uVar19 < (ulong)(pSVar8->monochrome == '\0') * 2 + 1; uVar19 = uVar19 + 1) {
        av1_alloc_restoration_struct(cm_00,rsi,(uint)(uVar19 != 0));
        rsi = rsi + 1;
      }
    }
    bVar13 = pSVar8->use_highbitdepth;
    iVar27 = 0x11040 << (bVar13 & 0x1f);
    if ((pbi->td).mc_buf_size != iVar27) {
      av1_free_mc_tmp_buf(&pbi->td);
      allocate_mc_tmp_buf(cm_00,&pbi->td,iVar27,(uint)bVar13);
    }
  }
  uVar2 = ((pbi->common).seq_params)->monochrome;
  iVar27 = pbi->max_threads;
  uVar21 = (pbi->common).tiles.large_scale;
  local_110 = data;
  if (iVar27 < 2) goto LAB_00160517;
  if ((uVar21 == 0) || (pbi->ext_tile_debug != 0)) {
    if (pbi->row_mt == 0) {
      if (start_tile < end_tile) {
        if (uVar21 != 0) goto LAB_00160660;
        uVar21 = (pbi->common).tiles.cols;
        iVar17 = (pbi->common).tiles.rows;
        uVar4 = iVar17 * uVar21;
        uVar16 = 0;
        iVar30 = 0;
        iVar6 = iVar17;
        uVar28 = uVar21;
        goto LAB_001606ba;
      }
      goto LAB_00160517;
    }
    uVar16 = (pbi->common).tiles.cols;
    uVar28 = (pbi->common).tiles.rows;
    if (uVar21 == 0) {
      uVar21 = 0;
      uVar25 = uVar28;
      uVar24 = uVar16;
      uVar23 = 0;
    }
    else {
      uVar4 = pbi->dec_tile_row;
      uVar5 = pbi->dec_tile_col;
      uVar23 = uVar16;
      if ((int)uVar5 < (int)uVar16) {
        uVar23 = uVar5;
      }
      uVar21 = uVar28;
      if ((int)uVar4 < (int)uVar28) {
        uVar21 = uVar4;
      }
      uVar25 = uVar21 + 1;
      if ((int)uVar4 < 0) {
        uVar25 = uVar28;
        uVar21 = 0;
      }
      uVar24 = uVar23 + 1;
      if ((int)uVar5 < 0) {
        uVar24 = uVar16;
        uVar23 = 0;
      }
    }
    if ((((int)uVar25 <= (int)uVar21) || ((int)uVar24 <= (int)uVar23)) ||
       ((end_tile < (int)(uVar21 * uVar16 + uVar23) ||
        ((int)((uVar25 - 1) * uVar16 + uVar24) <= start_tile)))) goto LAB_00161455;
    decode_mt_init(pbi);
    if ((pbi->common).tiles.large_scale == 0) {
      get_tile_buffers(pbi,data,data_end,pbi->tile_buffers,start_tile,end_tile);
      local_110 = (uint8_t *)0x0;
    }
    else {
      local_110 = get_ls_tile_buffers(pbi,data,data_end,pbi->tile_buffers);
    }
    uVar4 = uVar28 * uVar16;
    if (pbi->tile_data == (TileDataDec *)0x0) {
LAB_00160c8e:
      decoder_alloc_tile_data(pbi,uVar4);
    }
    else {
      uVar5 = pbi->allocated_tiles;
      if (uVar4 != uVar5) {
        lVar20 = 0x5360;
        for (lVar29 = 0; lVar29 < (int)uVar5; lVar29 = lVar29 + 1) {
          av1_dec_row_mt_dealloc
                    ((AV1DecRowMTSync *)
                     ((long)((pbi->tile_data->tctx).txb_skip_cdf + -2) + 0x3c + lVar20));
          uVar5 = pbi->allocated_tiles;
          lVar20 = lVar20 + 0x53a0;
        }
        goto LAB_00160c8e;
      }
    }
    if ((pbi->dcb).xd.seg_mask == (uint8_t *)0x0) {
      puVar9 = (uint8_t *)aom_memalign(0x10,0x8000);
      (pbi->dcb).xd.seg_mask = puVar9;
      if (puVar9 == (uint8_t *)0x0) {
        aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->dcb.xd.seg_mask");
      }
    }
    iVar17 = 0;
    uVar19 = 0;
    if (0 < (int)uVar16) {
      uVar19 = (ulong)uVar16;
    }
    uVar5 = 0;
    if (0 < (int)uVar28) {
      uVar5 = uVar28;
    }
    uVar7 = 0;
    for (uVar15 = 0; uVar15 != uVar5; uVar15 = uVar15 + 1) {
      iVar30 = 0;
      for (lVar20 = 0; uVar19 * 0x53a0 != lVar20; lVar20 = lVar20 + 0x53a0) {
        tile = (TileInfo *)
               ((long)(pbi->tile_data[(long)(pbi->common).tiles.cols * (long)(int)uVar15].tctx.
                       txb_skip_cdf + -2) + 0x3c + lVar20);
        av1_tile_init(tile,cm_00,uVar15,iVar30);
        iVar6 = av1_get_sb_rows_in_tile(cm_00,tile);
        if ((int)uVar7 <= iVar6) {
          uVar7 = av1_get_sb_rows_in_tile(cm_00,tile);
        }
        iVar6 = get_max_row_mt_workers_per_tile(cm_00,tile);
        iVar17 = iVar17 + iVar6;
        iVar30 = iVar30 + 1;
      }
    }
    if (iVar17 < iVar27) {
      iVar27 = iVar17;
    }
    lVar20 = (long)(int)uVar7;
    if (pbi->allocated_row_mt_sync_rows != uVar7) {
      uVar19 = 0;
      if (0 < (int)uVar7) {
        uVar19 = (ulong)uVar7;
      }
      uVar22 = 0;
      if (0 < (int)uVar4) {
        uVar22 = (ulong)uVar4;
      }
      for (uVar31 = 0; uVar31 != uVar22; uVar31 = uVar31 + 1) {
        pTVar3 = pbi->tile_data;
        dec_row_mt_sync = &pTVar3[uVar31].dec_row_mt_sync;
        av1_dec_row_mt_dealloc(dec_row_mt_sync);
        pTVar3[uVar31].dec_row_mt_sync.allocated_sb_rows = uVar7;
        ppVar10 = (pthread_mutex_t *)aom_malloc(lVar20 * 0x28);
        dec_row_mt_sync->mutex_ = ppVar10;
        if ((ppVar10 != (pthread_mutex_t *)0x0) ||
           (aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate dec_row_mt_sync->mutex_"),
           dec_row_mt_sync->mutex_ != (pthread_mutex_t *)0x0)) {
          for (lVar29 = 0; uVar19 * 0x28 - lVar29 != 0; lVar29 = lVar29 + 0x28) {
            pthread_mutex_init((pthread_mutex_t *)((long)dec_row_mt_sync->mutex_ + lVar29),
                               (pthread_mutexattr_t *)0x0);
          }
        }
        ppVar11 = (pthread_cond_t *)aom_malloc(lVar20 * 0x30);
        pTVar3[uVar31].dec_row_mt_sync.cond_ = ppVar11;
        if ((ppVar11 != (pthread_cond_t *)0x0) ||
           (aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate dec_row_mt_sync->cond_"),
           pTVar3[uVar31].dec_row_mt_sync.cond_ != (pthread_cond_t *)0x0)) {
          for (lVar29 = 0; uVar19 * 0x30 - lVar29 != 0; lVar29 = lVar29 + 0x30) {
            pthread_cond_init((pthread_cond_t *)
                              ((long)pTVar3[uVar31].dec_row_mt_sync.cond_ + lVar29),
                              (pthread_condattr_t *)0x0);
          }
        }
        piVar12 = (int *)aom_malloc(lVar20 * 4);
        pTVar3[uVar31].dec_row_mt_sync.cur_sb_col = piVar12;
        if (piVar12 == (int *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate dec_row_mt_sync->cur_sb_col");
        }
        pTVar3[uVar31].dec_row_mt_sync.sync_range = 1;
      }
      pbi->allocated_row_mt_sync_rows = uVar7;
    }
    tile_mt_queue(pbi,uVar16,uVar28,uVar21,uVar25,uVar23,uVar24,start_tile,end_tile);
    bVar13 = (byte)((pbi->common).seq_params)->mib_size_log2;
    iVar17 = (((pbi->common).mi_params.mi_cols >> (bVar13 & 0x1f)) + 1) *
             (((pbi->common).mi_params.mi_rows >> (bVar13 & 0x1f)) + 1);
    if (pbi->cb_buffer_alloc_size < iVar17) {
      av1_dec_free_cb_buf(pbi);
      __s = (CB_BUFFER *)aom_memalign(0x20,(long)iVar17 * 0x3b000);
      pbi->cb_buffer_base = __s;
      if (__s == (CB_BUFFER *)0x0) {
        aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->cb_buffer_base");
        __s = pbi->cb_buffer_base;
      }
      memset(__s,0,(long)iVar17 * 0x3b000);
      pbi->cb_buffer_alloc_size = iVar17;
    }
    (pbi->frame_row_mt_info).tile_rows_start = uVar21;
    (pbi->frame_row_mt_info).tile_rows_end = uVar25;
    (pbi->frame_row_mt_info).tile_cols_start = uVar23;
    (pbi->frame_row_mt_info).tile_cols_end = uVar24;
    (pbi->frame_row_mt_info).start_tile = start_tile;
    (pbi->frame_row_mt_info).end_tile = end_tile;
    (pbi->frame_row_mt_info).mi_rows_to_decode = 0;
    (pbi->frame_row_mt_info).mi_rows_parse_done = 0;
    (pbi->frame_row_mt_info).mi_rows_decode_started = 0;
    (pbi->frame_row_mt_info).row_mt_exit = 0;
    for (; lVar29 = (long)(int)uVar23 * 0x53a0 + 0x5398, lVar26 = (long)(int)uVar23,
        (int)uVar21 < (int)uVar25; uVar21 = uVar21 + 1) {
      for (; lVar26 < (int)uVar24; lVar26 = lVar26 + 1) {
        iVar17 = (pbi->common).tiles.cols * uVar21;
        iVar30 = iVar17 + (int)lVar26;
        if (iVar30 <= end_tile && start_tile <= iVar30) {
          pTVar3 = pbi->tile_data;
          *(undefined8 *)((long)(pTVar3[iVar17].tctx.txb_skip_cdf + -2) + 0x34 + lVar29) = 0;
          *(undefined4 *)((long)(pTVar3[iVar17].tctx.txb_skip_cdf + -2) + 0x3c + lVar29) = 0;
          uVar16 = -1 << ((byte)((pbi->common).seq_params)->mib_size_log2 & 0x1f);
          *(uint *)((long)(pTVar3[iVar17].tctx.txb_skip_cdf + -2) + 0x2c + lVar29) =
               (*(int *)((long)pTVar3 + lVar29 + -0x5394 + (long)iVar17 * 0x53a0) -
               *(int *)((long)pTVar3 + lVar29 + -0x5398 + (long)iVar17 * 0x53a0)) + ~uVar16 & uVar16
          ;
          *(uint *)((long)(pTVar3[iVar17].tctx.txb_skip_cdf + -2) + 0x30 + lVar29) =
               (~uVar16 + *(int *)((long)pTVar3 + lVar29 + -0x538c + (long)iVar17 * 0x53a0)) -
               *(int *)((long)pTVar3 + lVar29 + -0x5390 + (long)iVar17 * 0x53a0) & uVar16;
          iVar30 = av1_get_intrabc_extra_top_right_sb_delay(cm_00);
          *(int *)((long)(pTVar3[iVar17].tctx.txb_skip_cdf + -2) + 0x28 + lVar29) = iVar30;
          piVar12 = &(pbi->frame_row_mt_info).mi_rows_to_decode;
          *piVar12 = *piVar12 +
                     *(int *)((long)(pTVar3[iVar17].tctx.txb_skip_cdf + -2) + 0x2c + lVar29);
          memset(*(void **)((long)(pTVar3[iVar17].tctx.txb_skip_cdf + -2) + 0x1c + lVar29),0xff,
                 lVar20 << 2);
        }
        lVar29 = lVar29 + 0x53a0;
      }
    }
    if (pbi->row_mt_mutex_ == (pthread_mutex_t *)0x0) {
      ppVar10 = (pthread_mutex_t *)aom_malloc(0x28);
      pbi->row_mt_mutex_ = ppVar10;
      if (ppVar10 == (pthread_mutex_t *)0x0) {
        aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->row_mt_mutex_");
        ppVar10 = pbi->row_mt_mutex_;
        if (ppVar10 == (pthread_mutex_t *)0x0) goto LAB_001611c9;
      }
      pthread_mutex_init((pthread_mutex_t *)ppVar10,(pthread_mutexattr_t *)0x0);
    }
LAB_001611c9:
    if (pbi->row_mt_cond_ == (pthread_cond_t *)0x0) {
      __cond = (pthread_cond_t *)aom_malloc(0x30);
      pbi->row_mt_cond_ = (pthread_cond_t *)__cond;
      if (__cond == (pthread_cond_t *)0x0) {
        aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->row_mt_cond_");
        __cond = (pthread_cond_t *)pbi->row_mt_cond_;
        if (__cond == (pthread_cond_t *)0x0) goto LAB_0016121a;
      }
      pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    }
LAB_0016121a:
    reset_dec_workers(pbi,row_mt_worker_hook,iVar27);
    launch_dec_workers(pbi,data_end,iVar27);
    sync_dec_workers(pbi,iVar27);
    if ((pbi->dcb).corrupted != 0) {
      aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
    }
    if ((pbi->common).tiles.large_scale == 0) goto LAB_00161430;
joined_r0x0016127b:
    if (uVar4 != 1) goto LAB_00161455;
LAB_00161423:
    r = &pbi->tile_data->bit_reader;
LAB_0016144b:
    local_110 = aom_reader_find_end(r);
  }
  else {
    uVar21 = 1;
    if (start_tile < end_tile) {
LAB_00160660:
      uVar21 = 1;
      if (pbi->ext_tile_debug == 0) goto LAB_00160517;
      uVar21 = (pbi->common).tiles.cols;
      iVar17 = (pbi->common).tiles.rows;
      uVar4 = iVar17 * uVar21;
      uVar25 = pbi->dec_tile_col;
      uVar16 = uVar21;
      if ((int)uVar25 < (int)uVar21) {
        uVar16 = uVar25;
      }
      iVar14 = pbi->dec_tile_row;
      iVar30 = iVar17;
      if (iVar14 < iVar17) {
        iVar30 = iVar14;
      }
      iVar6 = iVar30 + 1;
      if (iVar14 < 0) {
        iVar30 = 0;
        iVar6 = iVar17;
      }
      uVar28 = uVar16 + 1;
      if ((int)uVar25 < 0) {
        uVar16 = 0;
        uVar28 = uVar21;
      }
LAB_001606ba:
      iVar14 = (end_tile - start_tile) + 1;
      if (iVar27 <= end_tile - start_tile) {
        iVar14 = iVar27;
      }
      if ((((iVar6 <= iVar30) || ((int)uVar28 <= (int)uVar16)) ||
          (end_tile < (int)(iVar30 * uVar21 + uVar16))) ||
         ((int)((iVar6 + -1) * uVar21 + uVar28) <= start_tile)) goto LAB_00161455;
      decode_mt_init(pbi);
      if ((pbi->common).tiles.large_scale == 0) {
        get_tile_buffers(pbi,data,data_end,pbi->tile_buffers,start_tile,end_tile);
        local_110 = (uint8_t *)0x0;
      }
      else {
        local_110 = get_ls_tile_buffers(pbi,data,data_end,pbi->tile_buffers);
      }
      if ((pbi->tile_data == (TileDataDec *)0x0) || (uVar4 != pbi->allocated_tiles)) {
        decoder_alloc_tile_data(pbi,uVar4);
      }
      if ((pbi->dcb).xd.seg_mask == (uint8_t *)0x0) {
        puVar9 = (uint8_t *)aom_memalign(0x10,0x8000);
        (pbi->dcb).xd.seg_mask = puVar9;
        if (puVar9 == (uint8_t *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->dcb.xd.seg_mask");
        }
      }
      iVar27 = 0;
      uVar19 = 0;
      if (0 < (int)uVar21) {
        uVar19 = (ulong)uVar21;
      }
      iVar18 = 0;
      if (0 < iVar17) {
        iVar18 = iVar17;
      }
      for (; iVar27 != iVar18; iVar27 = iVar27 + 1) {
        col_00 = 0;
        for (lVar20 = 0; uVar19 * 0x53a0 - lVar20 != 0; lVar20 = lVar20 + 0x53a0) {
          av1_tile_init((TileInfo *)
                        ((long)(pbi->tile_data[(long)(pbi->common).tiles.cols * (long)iVar27].tctx.
                                txb_skip_cdf + -2) + 0x3c + lVar20),cm_00,iVar27,col_00);
          col_00 = col_00 + 1;
        }
      }
      tile_mt_queue(pbi,uVar21,iVar17,iVar30,iVar6,uVar16,uVar28,start_tile,end_tile);
      reset_dec_workers(pbi,tile_worker_hook,iVar14);
      launch_dec_workers(pbi,data_end,iVar14);
      sync_dec_workers(pbi,iVar14);
      if ((pbi->dcb).corrupted != 0) {
        aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
      }
      if ((pbi->common).tiles.large_scale != 0) goto joined_r0x0016127b;
LAB_00161430:
      r = &pbi->tile_data[end_tile].bit_reader;
      goto LAB_0016144b;
    }
LAB_00160517:
    uVar16 = (pbi->common).tiles.cols;
    uVar4 = (pbi->common).tiles.rows;
    uVar28 = pbi->dec_tile_row;
    uVar25 = pbi->dec_tile_col;
    if (uVar21 == 0) {
      local_8c = pbi->inv_tile_order;
      uVar23 = 0;
      uVar7 = 0;
      uVar24 = uVar16;
      uVar5 = local_8c;
      uVar15 = uVar4;
    }
    else {
      uVar23 = uVar16;
      if ((int)uVar25 < (int)uVar16) {
        uVar23 = uVar25;
      }
      uVar7 = uVar4;
      if ((int)uVar28 < (int)uVar4) {
        uVar7 = uVar28;
      }
      uVar15 = uVar7 + 1;
      if ((int)uVar28 < 0) {
        uVar15 = uVar4;
        uVar7 = 0;
      }
      uVar24 = uVar23 + 1;
      if ((int)uVar25 < 0) {
        uVar24 = uVar16;
        uVar23 = 0;
      }
      bVar33 = pbi->inv_tile_order != 0;
      local_8c = (uint)((int)uVar28 < 0 && bVar33);
      uVar5 = (uint)((int)uVar25 < 0 && bVar33);
    }
    if ((((int)uVar7 < (int)uVar15) && ((int)uVar23 < (int)uVar24)) &&
       (((int)(uVar7 * uVar16 + uVar23) <= end_tile &&
        (start_tile < (int)((uVar15 - 1) * uVar16 + uVar24))))) {
      tile_buffers = pbi->tile_buffers;
      if (uVar21 == 0) {
        bVar13 = (pbi->common).features.disable_cdf_update ^ 1;
        get_tile_buffers(pbi,data,data_end,tile_buffers,start_tile,end_tile);
        local_110 = (uint8_t *)0x0;
      }
      else {
        if (pbi->ext_tile_debug == 0) {
          tile_buffers[(int)uVar28][(int)uVar25].data = data;
          uVar21 = pbi->coded_tile_data_size;
          tile_buffers[(int)uVar28][(int)uVar25].size = (ulong)uVar21;
          local_110 = data + uVar21;
        }
        else {
          local_110 = get_ls_tile_buffers(pbi,data,data_end,tile_buffers);
        }
        bVar13 = 0;
      }
      iVar27 = uVar4 * uVar16;
      if ((pbi->tile_data == (TileDataDec *)0x0) || (iVar27 != pbi->allocated_tiles)) {
        decoder_alloc_tile_data(pbi,iVar27);
      }
      td = &pbi->td;
      if ((pbi->dcb).xd.seg_mask == (uint8_t *)0x0) {
        puVar9 = (uint8_t *)aom_memalign(0x10,0x8000);
        (pbi->dcb).xd.seg_mask = puVar9;
        if (puVar9 == (uint8_t *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->dcb.xd.seg_mask");
        }
      }
      set_decode_func_pointers(td,3);
      memcpy(td,pbi,0x3b60);
      (pbi->td).dcb.corrupted = 0;
      puVar9 = (pbi->td).mc_buf[1];
      (pbi->td).dcb.mc_buf[0] = (pbi->td).mc_buf[0];
      (pbi->td).dcb.mc_buf[1] = puVar9;
      (pbi->td).dcb.xd.tmp_conv_dst = (pbi->td).tmp_conv_dst;
      for (lVar20 = 0x919a; lVar20 != 0x919c; lVar20 = lVar20 + 1) {
        *(undefined8 *)((long)pbi + lVar20 * 8 + -0x3b0d0) =
             *(undefined8 *)((long)((pbi->dcb).xd.plane[0].pre + -2) + lVar20 * 8);
      }
      for (; (int)uVar7 < (int)uVar15; uVar7 = uVar7 + 1) {
        uVar21 = ~uVar7 + uVar4;
        if (local_8c == 0) {
          uVar21 = uVar7;
        }
        lVar20 = (long)(int)uVar21;
        uVar28 = ~uVar23 + uVar16;
        for (uVar25 = uVar23; (int)uVar25 < (int)uVar24; uVar25 = uVar25 + 1) {
          col = uVar28;
          if (uVar5 == 0) {
            col = uVar25;
          }
          lVar29 = (pbi->common).tiles.cols * lVar20;
          iVar17 = (int)lVar29 + col;
          if (iVar17 <= end_tile && start_tile <= iVar17) {
            pTVar3 = pbi->tile_data;
            (pbi->td).bit_reader = &pTVar3[lVar29 + (int)col].bit_reader;
            memset(&(pbi->td).cb_buffer_base,0,0x30000);
            av1_tile_init(&(pbi->td).dcb.xd.tile,cm_00,uVar21,col);
            (pbi->td).dcb.xd.current_base_qindex = (pbi->common).quant_params.base_qindex;
            setup_bool_decoder((MACROBLOCKD *)td,tile_buffers[lVar20][(int)col].data,data_end,
                               tile_buffers[lVar20][(int)col].size,&pbi->error,(pbi->td).bit_reader,
                               bVar13);
            av1_init_macroblockd(cm_00,(MACROBLOCKD *)td);
            bVar33 = ((pbi->common).seq_params)->monochrome == '\0';
            av1_init_above_context
                      (&(pbi->common).above_contexts,bVar33 + 1 + (uint)bVar33,uVar21,
                       (MACROBLOCKD *)td);
            __dest = &pTVar3[lVar29 + (int)col].tctx;
            memcpy(__dest,(pbi->common).fc,0x52fc);
            (pbi->td).dcb.xd.tile_ctx = __dest;
            decode_tile(pbi,td,uVar21,col);
            aom_merge_corrupted_flag(&(pbi->dcb).corrupted,(pbi->td).dcb.corrupted);
            if ((pbi->dcb).corrupted != 0) {
              aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
            }
          }
          uVar28 = uVar28 - 1;
        }
      }
      if ((pbi->common).tiles.large_scale == 0) {
        r = &pbi->tile_data[end_tile].bit_reader;
        goto LAB_0016144b;
      }
      if (iVar27 == 1) goto LAB_00161423;
    }
  }
LAB_00161455:
  *p_data_end = local_110;
  if (uVar2 != '\0') {
    set_planes_to_neutral_grey((pbi->common).seq_params,(pbi->dcb).xd.cur_buf,1);
  }
  if ((pbi->common).tiles.cols * (pbi->common).tiles.rows + -1 != end_tile) {
    return;
  }
  cdef_sync = &pbi->cdef_sync;
  av1_alloc_cdef_buffers(cm_00,&pbi->cdef_worker,cdef_sync,pbi->num_workers,1);
  av1_alloc_cdef_sync(cm_00,cdef_sync,pbi->num_workers);
  if (((pbi->common).features.allow_intrabc == false) &&
     ((pbi->common).tiles.single_tile_decoding == 0)) {
    if (((pbi->common).lf.filter_level[0] != 0) || ((pbi->common).lf.filter_level[1] != 0)) {
      av1_loop_filter_frame_mt
                (&((pbi->common).cur_frame)->buf,cm_00,(MACROBLOCKD *)pbi,0,
                 (uint)(uVar2 == '\0') * 2 + 1,0,pbi->tile_workers,pbi->num_workers,
                 &pbi->lf_row_sync,0);
    }
    if ((pbi->skip_loop_filter == 0) && ((pbi->common).features.coded_lossless == false)) {
      bVar33 = true;
      if (((pbi->common).cdef_info.cdef_bits == 0) &&
         ((pbi->common).cdef_info.cdef_strengths[0] == 0)) {
        bVar33 = (pbi->common).cdef_info.cdef_uv_strengths[0] != 0;
      }
    }
    else {
      bVar33 = false;
    }
    bVar13 = ~bVar33 & (pbi->common).width == (pbi->common).superres_upscaled_width;
    bVar32 = true;
    if (((pbi->common).rst_info[0].frame_restoration_type == RESTORE_NONE) &&
       ((pbi->common).rst_info[1].frame_restoration_type == RESTORE_NONE)) {
      bVar32 = (pbi->common).rst_info[2].frame_restoration_type != RESTORE_NONE;
    }
    if (bVar13 == 0) {
      if (bVar32) {
        av1_loop_restoration_save_boundary_lines(&((pbi->common).cur_frame)->buf,cm_00,0);
      }
      if (bVar33 != false) {
        if (pbi->num_workers < 2) {
          av1_cdef_frame(&((pbi->common).cur_frame)->buf,cm_00,(MACROBLOCKD *)pbi,
                         av1_cdef_init_fb_row);
        }
        else {
          av1_cdef_frame_mt(cm_00,(MACROBLOCKD *)pbi,pbi->cdef_worker,pbi->tile_workers,cdef_sync,
                            pbi->num_workers,av1_cdef_init_fb_row_mt,0);
        }
      }
      if ((pbi->common).width != (pbi->common).superres_upscaled_width) {
        av1_superres_upscale(cm_00,(pbi->common).buffer_pool,false);
      }
      if (!bVar32) goto LAB_001614e7;
      av1_loop_restoration_save_boundary_lines(&((pbi->common).cur_frame)->buf,cm_00,1);
    }
    else if (!bVar32) goto LAB_001614e7;
    frame = (pbi->dcb).xd.cur_buf;
    if (pbi->num_workers < 2) {
      av1_loop_restoration_filter_frame(frame,cm_00,(uint)bVar13,&pbi->lr_ctxt);
    }
    else {
      av1_loop_restoration_filter_frame_mt
                (frame,cm_00,(uint)bVar13,pbi->tile_workers,pbi->num_workers,&pbi->lr_row_sync,
                 &pbi->lr_ctxt,0);
    }
  }
LAB_001614e7:
  if ((pbi->dcb).corrupted == 0) {
    if ((pbi->common).features.refresh_frame_context == '\x01') {
      memcpy((pbi->common).fc,&pbi->tile_data[pbi->context_update_tile_id].tctx,0x52fc);
      av1_reset_cdf_symbol_counters((pbi->common).fc);
    }
  }
  else {
    aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Decode failed. Frame data is corrupted."
                      );
  }
  if ((pbi->common).tiles.large_scale == 0) {
    memcpy(&((pbi->common).cur_frame)->frame_context,(pbi->common).fc,0x52fc);
  }
  if (((pbi->common).show_frame != 0) &&
     ((((pbi->common).seq_params)->order_hint_info).enable_order_hint == 0)) {
    puVar1 = &(pbi->common).current_frame.frame_number;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void av1_decode_tg_tiles_and_wrapup(AV1Decoder *pbi, const uint8_t *data,
                                    const uint8_t *data_end,
                                    const uint8_t **p_data_end, int start_tile,
                                    int end_tile, int initialize_flag) {
  AV1_COMMON *const cm = &pbi->common;
  CommonTileParams *const tiles = &cm->tiles;
  MACROBLOCKD *const xd = &pbi->dcb.xd;
  const int tile_count_tg = end_tile - start_tile + 1;

  xd->error_info = cm->error;
  if (initialize_flag) setup_frame_info(pbi);
  const int num_planes = av1_num_planes(cm);

  if (pbi->max_threads > 1 && !(tiles->large_scale && !pbi->ext_tile_debug) &&
      pbi->row_mt)
    *p_data_end =
        decode_tiles_row_mt(pbi, data, data_end, start_tile, end_tile);
  else if (pbi->max_threads > 1 && tile_count_tg > 1 &&
           !(tiles->large_scale && !pbi->ext_tile_debug))
    *p_data_end = decode_tiles_mt(pbi, data, data_end, start_tile, end_tile);
  else
    *p_data_end = decode_tiles(pbi, data, data_end, start_tile, end_tile);

  // If the bit stream is monochrome, set the U and V buffers to a constant.
  if (num_planes < 3) {
    set_planes_to_neutral_grey(cm->seq_params, xd->cur_buf, 1);
  }

  if (end_tile != tiles->rows * tiles->cols - 1) {
    return;
  }

  av1_alloc_cdef_buffers(cm, &pbi->cdef_worker, &pbi->cdef_sync,
                         pbi->num_workers, 1);
  av1_alloc_cdef_sync(cm, &pbi->cdef_sync, pbi->num_workers);

  if (!cm->features.allow_intrabc && !tiles->single_tile_decoding) {
    if (cm->lf.filter_level[0] || cm->lf.filter_level[1]) {
      av1_loop_filter_frame_mt(&cm->cur_frame->buf, cm, &pbi->dcb.xd, 0,
                               num_planes, 0, pbi->tile_workers,
                               pbi->num_workers, &pbi->lf_row_sync, 0);
    }

    const int do_cdef =
        !pbi->skip_loop_filter && !cm->features.coded_lossless &&
        (cm->cdef_info.cdef_bits || cm->cdef_info.cdef_strengths[0] ||
         cm->cdef_info.cdef_uv_strengths[0]);
    const int do_superres = av1_superres_scaled(cm);
    const int optimized_loop_restoration = !do_cdef && !do_superres;
    const int do_loop_restoration =
        cm->rst_info[0].frame_restoration_type != RESTORE_NONE ||
        cm->rst_info[1].frame_restoration_type != RESTORE_NONE ||
        cm->rst_info[2].frame_restoration_type != RESTORE_NONE;
    // Frame border extension is not required in the decoder
    // as it happens in extend_mc_border().
    int do_extend_border_mt = 0;
    if (!optimized_loop_restoration) {
      if (do_loop_restoration)
        av1_loop_restoration_save_boundary_lines(&pbi->common.cur_frame->buf,
                                                 cm, 0);

      if (do_cdef) {
        if (pbi->num_workers > 1) {
          av1_cdef_frame_mt(cm, &pbi->dcb.xd, pbi->cdef_worker,
                            pbi->tile_workers, &pbi->cdef_sync,
                            pbi->num_workers, av1_cdef_init_fb_row_mt,
                            do_extend_border_mt);
        } else {
          av1_cdef_frame(&pbi->common.cur_frame->buf, cm, &pbi->dcb.xd,
                         av1_cdef_init_fb_row);
        }
      }

      superres_post_decode(pbi);

      if (do_loop_restoration) {
        av1_loop_restoration_save_boundary_lines(&pbi->common.cur_frame->buf,
                                                 cm, 1);
        if (pbi->num_workers > 1) {
          av1_loop_restoration_filter_frame_mt(
              (YV12_BUFFER_CONFIG *)xd->cur_buf, cm, optimized_loop_restoration,
              pbi->tile_workers, pbi->num_workers, &pbi->lr_row_sync,
              &pbi->lr_ctxt, do_extend_border_mt);
        } else {
          av1_loop_restoration_filter_frame((YV12_BUFFER_CONFIG *)xd->cur_buf,
                                            cm, optimized_loop_restoration,
                                            &pbi->lr_ctxt);
        }
      }
    } else {
      // In no cdef and no superres case. Provide an optimized version of
      // loop_restoration_filter.
      if (do_loop_restoration) {
        if (pbi->num_workers > 1) {
          av1_loop_restoration_filter_frame_mt(
              (YV12_BUFFER_CONFIG *)xd->cur_buf, cm, optimized_loop_restoration,
              pbi->tile_workers, pbi->num_workers, &pbi->lr_row_sync,
              &pbi->lr_ctxt, do_extend_border_mt);
        } else {
          av1_loop_restoration_filter_frame((YV12_BUFFER_CONFIG *)xd->cur_buf,
                                            cm, optimized_loop_restoration,
                                            &pbi->lr_ctxt);
        }
      }
    }
  }

  if (!pbi->dcb.corrupted) {
    if (cm->features.refresh_frame_context == REFRESH_FRAME_CONTEXT_BACKWARD) {
      assert(pbi->context_update_tile_id < pbi->allocated_tiles);
      *cm->fc = pbi->tile_data[pbi->context_update_tile_id].tctx;
      av1_reset_cdf_symbol_counters(cm->fc);
    }
  } else {
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "Decode failed. Frame data is corrupted.");
  }

#if CONFIG_INSPECTION
  if (pbi->inspect_cb != NULL) {
    (*pbi->inspect_cb)(pbi, pbi->inspect_ctx);
  }
#endif

  // Non frame parallel update frame context here.
  if (!tiles->large_scale) {
    cm->cur_frame->frame_context = *cm->fc;
  }

  if (cm->show_frame && !cm->seq_params->order_hint_info.enable_order_hint) {
    ++cm->current_frame.frame_number;
  }
}